

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

UBool ucurr_isAvailable_63(UChar *isoCode,UDate from,UDate to,UErrorCode *eErrorCode)

{
  UHashtable *pUVar1;
  UBool UVar2;
  int32_t iVar3;
  int iVar4;
  UHashtable *hash;
  UResourceBundle *pUVar5;
  UResourceBundle *resB;
  undefined8 *value;
  UResourceBundle *pUVar6;
  int32_t *piVar7;
  void *pvVar8;
  ulong uVar9;
  uint uVar10;
  int indexR;
  double dVar11;
  UErrorCode localStatus;
  int32_t fromLength;
  int32_t isoLength;
  UErrorCode local_98;
  int32_t local_94;
  UResourceBundle *local_90;
  UDate local_88;
  UDate local_80;
  UErrorCode *local_78;
  int32_t local_6c;
  UChar *local_68;
  ulong local_60;
  UHashtable *local_58;
  UResourceBundle *local_50;
  double local_48;
  double local_40;
  UChar *local_38;
  
  if (U_ZERO_ERROR < *eErrorCode) goto LAB_002b2987;
  if ((gIsoCodesInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
     (local_88 = from, local_80 = to, UVar2 = icu_63::umtx_initImplPreInit(&gIsoCodesInitOnce),
     from = local_88, to = local_80, UVar2 == '\0')) {
    if (U_ZERO_ERROR < gIsoCodesInitOnce.fErrCode) {
      *eErrorCode = gIsoCodesInitOnce.fErrCode;
    }
    goto LAB_002b2987;
  }
  ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
  hash = uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,(undefined1 *)0x0,eErrorCode);
  pUVar1 = gIsoCodes;
  if (*eErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uhash_setValueDeleter_63(hash,deleteIsoCodeEntry);
    local_98 = U_ZERO_ERROR;
    pUVar5 = ures_openDirect_63("icudt63l-curr","supplementalData",&local_98);
    pUVar5 = ures_getByKey_63(pUVar5,"CurrencyMap",pUVar5,&local_98);
    if (local_98 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_90 = pUVar5;
      iVar3 = ures_getSize_63(pUVar5);
      pUVar5 = local_90;
      if (iVar3 < 1) goto LAB_002b26b9;
      uVar9 = 0;
      local_78 = eErrorCode;
      local_68 = isoCode;
      local_58 = hash;
      do {
        local_60 = uVar9;
        pUVar5 = ures_getByIndex_63(local_90,(int32_t)uVar9,(UResourceBundle *)0x0,&local_98);
        if (local_98 < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar3 = ures_getSize_63(pUVar5);
          if (0 < iVar3) {
            indexR = 0;
            local_50 = pUVar5;
            do {
              resB = ures_getByIndex_63(pUVar5,indexR,(UResourceBundle *)0x0,&local_98);
              value = (undefined8 *)uprv_malloc_63(0x18);
              if (value == (undefined8 *)0x0) {
                *local_78 = U_MEMORY_ALLOCATION_ERROR;
                iVar4 = 1;
              }
              else {
                local_6c = 0;
                pUVar5 = ures_getByKey_63(resB,"id",(UResourceBundle *)0x0,&local_98);
                if (pUVar5 == (UResourceBundle *)0x0) {
                  iVar4 = 7;
                  pUVar5 = local_50;
                }
                else {
                  local_38 = ures_getString_63(pUVar5,&local_6c,&local_98);
                  pUVar6 = ures_getByKey_63(resB,"from",(UResourceBundle *)0x0,&local_98);
                  dVar11 = -1.79769313486232e+308;
                  if (local_98 < U_ILLEGAL_ARGUMENT_ERROR) {
                    local_94 = 0;
                    piVar7 = ures_getIntVector_63(pUVar6,&local_94,&local_98);
                    dVar11 = (double)CONCAT44(*piVar7,piVar7[1]);
                  }
                  local_40 = dVar11;
                  ures_close_63(pUVar6);
                  local_98 = U_ZERO_ERROR;
                  pUVar6 = ures_getByKey_63(resB,"to",(UResourceBundle *)0x0,&local_98);
                  dVar11 = 1.79769313486232e+308;
                  if (local_98 < U_ILLEGAL_ARGUMENT_ERROR) {
                    local_94 = 0;
                    piVar7 = ures_getIntVector_63(pUVar6,&local_94,&local_98);
                    dVar11 = (double)CONCAT44(*piVar7,piVar7[1]);
                  }
                  local_48 = dVar11;
                  ures_close_63(pUVar6);
                  ures_close_63(pUVar5);
                  ures_close_63(resB);
                  hash = local_58;
                  *value = local_38;
                  value[1] = local_40;
                  value[2] = local_48;
                  local_98 = U_ZERO_ERROR;
                  uhash_put_63(local_58,local_38,value,&local_98);
                  iVar4 = 0;
                  pUVar5 = local_50;
                }
              }
              if ((iVar4 != 7) && (iVar4 != 0)) goto LAB_002b2909;
              indexR = indexR + 1;
              iVar3 = ures_getSize_63(pUVar5);
            } while (indexR < iVar3);
          }
          iVar4 = 5;
LAB_002b2909:
          isoCode = local_68;
          if (iVar4 == 5) goto LAB_002b2913;
        }
        else {
          *local_78 = local_98;
LAB_002b2913:
          ures_close_63(pUVar5);
          iVar4 = 0;
        }
        if (iVar4 != 0) goto LAB_002b294d;
        uVar10 = (int)local_60 + 1;
        uVar9 = (ulong)uVar10;
        iVar3 = ures_getSize_63(local_90);
      } while ((int)uVar10 < iVar3);
      iVar4 = 2;
LAB_002b294d:
      eErrorCode = local_78;
      pUVar5 = local_90;
      if (iVar4 == 2) goto LAB_002b26b9;
    }
    else {
      *eErrorCode = local_98;
LAB_002b26b9:
      ures_close_63(pUVar5);
    }
    pUVar1 = hash;
    if (U_ZERO_ERROR < *eErrorCode) {
      uhash_close_63(hash);
      pUVar1 = gIsoCodes;
    }
  }
  gIsoCodes = pUVar1;
  gIsoCodesInitOnce.fErrCode = *eErrorCode;
  icu_63::umtx_initImplPostInit(&gIsoCodesInitOnce);
  from = local_88;
  to = local_80;
LAB_002b2987:
  if ((*eErrorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     (local_88 = from, local_80 = to, pvVar8 = uhash_get_63(gIsoCodes,isoCode),
     pvVar8 != (void *)0x0)) {
    if (local_88 <= local_80) {
      if ((local_88 < *(double *)((long)pvVar8 + 0x10) ||
           local_88 == *(double *)((long)pvVar8 + 0x10)) &&
         (*(double *)((long)pvVar8 + 8) <= local_80)) {
        return '\x01';
      }
    }
    else {
      *eErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
ucurr_isAvailable(const UChar* isoCode, UDate from, UDate to, UErrorCode* eErrorCode) {
    umtx_initOnce(gIsoCodesInitOnce, &initIsoCodes, *eErrorCode);
    if (U_FAILURE(*eErrorCode)) {
        return FALSE;
    }

    IsoCodeEntry* result = (IsoCodeEntry *) uhash_get(gIsoCodes, isoCode);
    if (result == NULL) {
        return FALSE;
    } else if (from > to) {
        *eErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    } else if  ((from > result->to) || (to < result->from)) {
        return FALSE;
    }
    return TRUE;
}